

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  string file_name;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_74 = (int)file;
  std::__cxx11::string::string((string *)&local_50,(char *)this,(allocator *)&local_70);
  if ((int)file < 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_50);
  }
  else {
    std::operator+(&local_70,&local_50,":");
    StreamableToString<int>(&local_30,&local_74);
    std::operator+(__return_storage_ptr__,&local_70,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}